

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_textedit.h
# Opt level: O0

int ImStb::stb_textedit_paste_internal
              (ImGuiInputTextState *str,STB_TexteditState *state,ImWchar *text,int len)

{
  bool bVar1;
  int in_ECX;
  ImGuiInputTextState *in_RDX;
  int *in_RSI;
  undefined8 in_RDI;
  int in_stack_ffffffffffffffd8;
  int new_text_len;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  new_text_len = (int)((ulong)in_RDI >> 0x20);
  stb_textedit_clamp(in_RDX,(STB_TexteditState *)CONCAT44(in_ECX,in_stack_ffffffffffffffd8));
  stb_textedit_delete_selection
            (in_RDX,(STB_TexteditState *)CONCAT44(in_ECX,in_stack_ffffffffffffffd8));
  bVar1 = STB_TEXTEDIT_INSERTCHARS
                    ((ImGuiInputTextState *)text,len,
                     (ImWchar *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                     new_text_len);
  if (bVar1) {
    stb_text_makeundo_insert((STB_TexteditState *)in_RDX,in_ECX,in_stack_ffffffffffffffd8);
    *in_RSI = in_ECX + *in_RSI;
    *(undefined1 *)((long)in_RSI + 0x16) = 0;
  }
  return (uint)bVar1;
}

Assistant:

static int stb_textedit_paste_internal(IMSTB_TEXTEDIT_STRING *str, STB_TexteditState *state, IMSTB_TEXTEDIT_CHARTYPE *text, int len)
{
   // if there's a selection, the paste should delete it
   stb_textedit_clamp(str, state);
   stb_textedit_delete_selection(str,state);
   // try to insert the characters
   if (STB_TEXTEDIT_INSERTCHARS(str, state->cursor, text, len)) {
      stb_text_makeundo_insert(state, state->cursor, len);
      state->cursor += len;
      state->has_preferred_x = 0;
      return 1;
   }
   // note: paste failure will leave deleted selection, may be restored with an undo (see https://github.com/nothings/stb/issues/734 for details)
   return 0;
}